

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_sse2.c
# Opt level: O2

_Bool av1_resize_vert_dir_sse2
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int stride,
                int start_col)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  ushort uVar42;
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  unkuint9 Var50;
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  undefined1 auVar53 [11];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  _Bool _Var66;
  ulong *puVar67;
  long lVar68;
  int start_col_00;
  uint8_t *puVar69;
  uint8_t *puVar70;
  ulong uVar71;
  long lVar72;
  int i;
  ulong uVar73;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  __m128i l7;
  undefined1 auVar74 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  short sVar85;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sVar89;
  undefined1 auVar88 [16];
  ushort uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  
  auVar65 = _DAT_004ba8a0;
  auVar64 = _DAT_004ba890;
  start_col_00 = start_col;
  if (7 < height && (height & 1U) == 0) {
    start_col_00 = stride - stride % 8;
    lVar72 = (long)stride;
    lVar68 = (long)start_col;
    puVar69 = output + lVar68;
    for (; lVar68 < start_col_00; lVar68 = lVar68 + 8) {
      uVar73 = *(ulong *)(intbuf + lVar68);
      uVar71 = *(ulong *)(intbuf + lVar72 + lVar68);
      uVar1 = *(ulong *)(intbuf + lVar72 * 2 + lVar68);
      auVar8._8_6_ = 0;
      auVar8._0_8_ = uVar73;
      auVar8[0xe] = (char)(uVar73 >> 0x38);
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar73;
      auVar13[0xc] = (char)(uVar73 >> 0x30);
      auVar13._13_2_ = auVar8._13_2_;
      auVar18._8_4_ = 0;
      auVar18._0_8_ = uVar73;
      auVar18._12_3_ = auVar13._12_3_;
      auVar23._8_2_ = 0;
      auVar23._0_8_ = uVar73;
      auVar23[10] = (char)(uVar73 >> 0x28);
      auVar23._11_4_ = auVar18._11_4_;
      auVar28._8_2_ = 0;
      auVar28._0_8_ = uVar73;
      auVar28._10_5_ = auVar23._10_5_;
      auVar33[8] = (char)(uVar73 >> 0x20);
      auVar33._0_8_ = uVar73;
      auVar33._9_6_ = auVar28._9_6_;
      auVar46._7_8_ = 0;
      auVar46._0_7_ = auVar33._8_7_;
      auVar54._1_8_ = SUB158(auVar46 << 0x40,7);
      auVar54[0] = (char)(uVar73 >> 0x18);
      auVar54._9_6_ = 0;
      auVar55._1_10_ = SUB1510(auVar54 << 0x30,5);
      auVar55[0] = (char)(uVar73 >> 0x10);
      auVar55._11_4_ = 0;
      auVar38[2] = (char)(uVar73 >> 8);
      auVar38._0_2_ = (ushort)uVar73;
      auVar38._3_12_ = SUB1512(auVar55 << 0x20,3);
      auVar81._0_2_ = (ushort)uVar73 & 0xff;
      auVar81._2_13_ = auVar38._2_13_;
      auVar81[0xf] = 0;
      auVar9._8_6_ = 0;
      auVar9._0_8_ = uVar71;
      auVar9[0xe] = (char)(uVar71 >> 0x38);
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar71;
      auVar14[0xc] = (char)(uVar71 >> 0x30);
      auVar14._13_2_ = auVar9._13_2_;
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar71;
      auVar19._12_3_ = auVar14._12_3_;
      auVar24._8_2_ = 0;
      auVar24._0_8_ = uVar71;
      auVar24[10] = (char)(uVar71 >> 0x28);
      auVar24._11_4_ = auVar19._11_4_;
      auVar29._8_2_ = 0;
      auVar29._0_8_ = uVar71;
      auVar29._10_5_ = auVar24._10_5_;
      auVar34[8] = (char)(uVar71 >> 0x20);
      auVar34._0_8_ = uVar71;
      auVar34._9_6_ = auVar29._9_6_;
      auVar47._7_8_ = 0;
      auVar47._0_7_ = auVar34._8_7_;
      auVar56._1_8_ = SUB158(auVar47 << 0x40,7);
      auVar56[0] = (char)(uVar71 >> 0x18);
      auVar56._9_6_ = 0;
      auVar57._1_10_ = SUB1510(auVar56 << 0x30,5);
      auVar57[0] = (char)(uVar71 >> 0x10);
      auVar57._11_4_ = 0;
      auVar39[2] = (char)(uVar71 >> 8);
      auVar39._0_2_ = (ushort)uVar71;
      auVar39._3_12_ = SUB1512(auVar57 << 0x20,3);
      auVar86._0_2_ = (ushort)uVar71 & 0xff;
      auVar86._2_13_ = auVar39._2_13_;
      auVar86[0xf] = 0;
      auVar10._8_6_ = 0;
      auVar10._0_8_ = uVar1;
      auVar10[0xe] = (char)(uVar1 >> 0x38);
      auVar15._8_4_ = 0;
      auVar15._0_8_ = uVar1;
      auVar15[0xc] = (char)(uVar1 >> 0x30);
      auVar15._13_2_ = auVar10._13_2_;
      auVar20._8_4_ = 0;
      auVar20._0_8_ = uVar1;
      auVar20._12_3_ = auVar15._12_3_;
      auVar25._8_2_ = 0;
      auVar25._0_8_ = uVar1;
      auVar25[10] = (char)(uVar1 >> 0x28);
      auVar25._11_4_ = auVar20._11_4_;
      auVar30._8_2_ = 0;
      auVar30._0_8_ = uVar1;
      auVar30._10_5_ = auVar25._10_5_;
      auVar35[8] = (char)(uVar1 >> 0x20);
      auVar35._0_8_ = uVar1;
      auVar35._9_6_ = auVar30._9_6_;
      auVar48._7_8_ = 0;
      auVar48._0_7_ = auVar35._8_7_;
      auVar58._1_8_ = SUB158(auVar48 << 0x40,7);
      auVar58[0] = (char)(uVar1 >> 0x18);
      auVar58._9_6_ = 0;
      auVar59._1_10_ = SUB1510(auVar58 << 0x30,5);
      auVar59[0] = (char)(uVar1 >> 0x10);
      auVar59._11_4_ = 0;
      auVar40[2] = (char)(uVar1 >> 8);
      auVar40._0_2_ = (ushort)uVar1;
      auVar40._3_12_ = SUB1512(auVar59 << 0x20,3);
      auVar44._2_13_ = auVar40._2_13_;
      auVar44._0_2_ = (ushort)uVar1 & 0xff;
      puVar67 = (ulong *)(intbuf + stride * 3 + lVar68);
      uVar73 = 0;
      puVar70 = puVar69;
      auVar84 = auVar81;
      auVar82 = auVar81;
      auVar88 = auVar81;
      while( true ) {
        auVar87 = auVar81;
        auVar81[0xf] = 0;
        auVar81._0_15_ = auVar44;
        uVar71 = *puVar67;
        auVar11._8_6_ = 0;
        auVar11._0_8_ = uVar71;
        auVar11[0xe] = (char)(uVar71 >> 0x38);
        auVar16._8_4_ = 0;
        auVar16._0_8_ = uVar71;
        auVar16[0xc] = (char)(uVar71 >> 0x30);
        auVar16._13_2_ = auVar11._13_2_;
        auVar21._8_4_ = 0;
        auVar21._0_8_ = uVar71;
        auVar21._12_3_ = auVar16._12_3_;
        auVar26._8_2_ = 0;
        auVar26._0_8_ = uVar71;
        auVar26[10] = (char)(uVar71 >> 0x28);
        auVar26._11_4_ = auVar21._11_4_;
        auVar31._8_2_ = 0;
        auVar31._0_8_ = uVar71;
        auVar31._10_5_ = auVar26._10_5_;
        auVar36[8] = (char)(uVar71 >> 0x20);
        auVar36._0_8_ = uVar71;
        auVar36._9_6_ = auVar31._9_6_;
        auVar49._7_8_ = 0;
        auVar49._0_7_ = auVar36._8_7_;
        Var50 = CONCAT81(SUB158(auVar49 << 0x40,7),(char)(uVar71 >> 0x18));
        auVar60._9_6_ = 0;
        auVar60._0_9_ = Var50;
        auVar51._1_10_ = SUB1510(auVar60 << 0x30,5);
        auVar51[0] = (char)(uVar71 >> 0x10);
        auVar61._11_4_ = 0;
        auVar61._0_11_ = auVar51;
        auVar41[2] = (char)(uVar71 >> 8);
        auVar41._0_2_ = (ushort)uVar71;
        auVar41._3_12_ = SUB1512(auVar61 << 0x20,3);
        auVar74._0_2_ = (ushort)uVar71 & 0xff;
        auVar74._2_13_ = auVar41._2_13_;
        auVar74[0xf] = 0;
        sVar75 = auVar41._2_2_;
        sVar76 = auVar51._0_2_;
        sVar77 = (short)Var50;
        sVar78 = auVar36._8_2_;
        sVar79 = auVar26._10_2_;
        sVar80 = auVar16._12_2_;
        uVar42 = auVar11._13_2_ >> 8;
        uVar71 = (ulong)(height - 4);
        if (height - 4 <= uVar73) break;
        uVar71 = *(ulong *)((long)puVar67 + lVar72);
        auVar12._8_6_ = 0;
        auVar12._0_8_ = uVar71;
        auVar12[0xe] = (char)(uVar71 >> 0x38);
        auVar17._8_4_ = 0;
        auVar17._0_8_ = uVar71;
        auVar17[0xc] = (char)(uVar71 >> 0x30);
        auVar17._13_2_ = auVar12._13_2_;
        auVar22._8_4_ = 0;
        auVar22._0_8_ = uVar71;
        auVar22._12_3_ = auVar17._12_3_;
        auVar27._8_2_ = 0;
        auVar27._0_8_ = uVar71;
        auVar27[10] = (char)(uVar71 >> 0x28);
        auVar27._11_4_ = auVar22._11_4_;
        auVar32._8_2_ = 0;
        auVar32._0_8_ = uVar71;
        auVar32._10_5_ = auVar27._10_5_;
        auVar37[8] = (char)(uVar71 >> 0x20);
        auVar37._0_8_ = uVar71;
        auVar37._9_6_ = auVar32._9_6_;
        auVar52._7_8_ = 0;
        auVar52._0_7_ = auVar37._8_7_;
        Var50 = CONCAT81(SUB158(auVar52 << 0x40,7),(char)(uVar71 >> 0x18));
        auVar62._9_6_ = 0;
        auVar62._0_9_ = Var50;
        auVar53._1_10_ = SUB1510(auVar62 << 0x30,5);
        auVar53[0] = (char)(uVar71 >> 0x10);
        auVar63._11_4_ = 0;
        auVar63._0_11_ = auVar53;
        auVar43[2] = (char)(uVar71 >> 8);
        auVar43._0_2_ = (ushort)uVar71;
        auVar43._3_12_ = SUB1512(auVar63 << 0x20,3);
        uVar90 = (ushort)uVar71 & 0xff;
        auVar45._2_13_ = auVar43._2_13_;
        auVar45._0_2_ = uVar90;
        sVar85 = auVar84._6_2_ + (short)Var50;
        sVar89 = auVar44._6_2_ + auVar82._6_2_;
        auVar91._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar88._6_2_ + sVar77,sVar85),auVar88._4_2_ + sVar76),
                       CONCAT22(auVar84._4_2_ + auVar53._0_2_,sVar85)) >> 0x10);
        auVar91._6_2_ = auVar88._2_2_ + sVar75;
        auVar91._4_2_ = auVar84._2_2_ + auVar43._2_2_;
        auVar91._2_2_ = auVar88._0_2_ + auVar74._0_2_;
        auVar91._0_2_ = auVar84._0_2_ + uVar90;
        auVar95._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar86._6_2_ + auVar87._6_2_,sVar89),
                                auVar86._4_2_ + auVar87._4_2_),
                       CONCAT22(auVar44._4_2_ + auVar82._4_2_,sVar89)) >> 0x10);
        auVar95._6_2_ = auVar86._2_2_ + auVar87._2_2_;
        auVar95._4_2_ = auVar44._2_2_ + auVar82._2_2_;
        auVar95._2_2_ = auVar86._0_2_ + auVar87._0_2_;
        auVar95._0_2_ = auVar44._0_2_ + auVar82._0_2_;
        auVar83._2_2_ = auVar88._8_2_ + sVar78;
        auVar83._0_2_ = auVar84._8_2_ + auVar37._8_2_;
        auVar83._4_2_ = auVar84._10_2_ + auVar27._10_2_;
        auVar83._6_2_ = auVar88._10_2_ + sVar79;
        auVar83._8_2_ = auVar84._12_2_ + auVar17._12_2_;
        auVar83._10_2_ = auVar88._12_2_ + sVar80;
        auVar83._12_2_ = auVar84._14_2_ + (auVar12._13_2_ >> 8);
        auVar83._14_2_ = auVar88._14_2_ + uVar42;
        auVar88._2_2_ = auVar86._8_2_ + auVar87._8_2_;
        auVar88._0_2_ = auVar44._8_2_ + auVar82._8_2_;
        auVar88._4_2_ = auVar44._10_2_ + auVar82._10_2_;
        auVar88._6_2_ = auVar86._10_2_ + auVar87._10_2_;
        auVar88._8_2_ = auVar44._12_2_ + auVar82._12_2_;
        auVar88._10_2_ = auVar86._12_2_ + auVar87._12_2_;
        auVar88._12_2_ = (ushort)auVar44[0xe] + auVar82._14_2_;
        auVar88._14_2_ = auVar86._14_2_ + auVar87._14_2_;
        auVar92 = pmaddwd(auVar91,auVar64);
        auVar96 = pmaddwd(auVar95,auVar65);
        auVar84 = pmaddwd(auVar83,auVar64);
        auVar88 = pmaddwd(auVar88,auVar65);
        auVar97._0_4_ = auVar96._0_4_ + 0x40 + auVar92._0_4_ >> 7;
        auVar97._4_4_ = auVar96._4_4_ + 0x40 + auVar92._4_4_ >> 7;
        auVar97._8_4_ = auVar96._8_4_ + 0x40 + auVar92._8_4_ >> 7;
        auVar97._12_4_ = auVar96._12_4_ + 0x40 + auVar92._12_4_ >> 7;
        auVar92._0_4_ = auVar88._0_4_ + 0x40 + auVar84._0_4_ >> 7;
        auVar92._4_4_ = auVar88._4_4_ + 0x40 + auVar84._4_4_ >> 7;
        auVar92._8_4_ = auVar88._8_4_ + 0x40 + auVar84._8_4_ >> 7;
        auVar92._12_4_ = auVar88._12_4_ + 0x40 + auVar84._12_4_ >> 7;
        auVar84 = packssdw(auVar97,auVar92);
        sVar75 = auVar84._0_2_;
        sVar76 = auVar84._2_2_;
        sVar77 = auVar84._4_2_;
        sVar78 = auVar84._6_2_;
        sVar79 = auVar84._8_2_;
        sVar80 = auVar84._10_2_;
        sVar85 = auVar84._12_2_;
        sVar89 = auVar84._14_2_;
        *(ulong *)puVar70 =
             CONCAT17((0 < sVar89) * (sVar89 < 0x100) * auVar84[0xe] - (0xff < sVar89),
                      CONCAT16((0 < sVar85) * (sVar85 < 0x100) * auVar84[0xc] - (0xff < sVar85),
                               CONCAT15((0 < sVar80) * (sVar80 < 0x100) * auVar84[10] -
                                        (0xff < sVar80),
                                        CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar84[8] -
                                                 (0xff < sVar79),
                                                 CONCAT13((0 < sVar78) * (sVar78 < 0x100) *
                                                          auVar84[6] - (0xff < sVar78),
                                                          CONCAT12((0 < sVar77) * (sVar77 < 0x100) *
                                                                   auVar84[4] - (0xff < sVar77),
                                                                   CONCAT11((0 < sVar76) *
                                                                            (sVar76 < 0x100) *
                                                                            auVar84[2] -
                                                                            (0xff < sVar76),
                                                                            (0 < sVar75) *
                                                                            (sVar75 < 0x100) *
                                                                            auVar84[0] -
                                                                            (0xff < sVar75))))))));
        puVar67 = (ulong *)((long)puVar67 + lVar72 * 2);
        uVar73 = uVar73 + 2;
        puVar70 = puVar70 + out_stride;
        auVar84 = auVar82;
        auVar82 = auVar86;
        auVar88 = auVar87;
        auVar86 = auVar74;
        auVar44 = auVar45;
      }
      for (; auVar92 = auVar87, auVar83 = auVar82, uVar71 < (uint)height; uVar71 = uVar71 + 2) {
        sVar85 = auVar84._6_2_ + sVar77;
        sVar89 = auVar83._6_2_ + auVar81._6_2_;
        auVar93._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar88._6_2_ + sVar77,sVar85),auVar88._4_2_ + sVar76),
                       CONCAT22(auVar84._4_2_ + sVar76,sVar85)) >> 0x10);
        auVar93._6_2_ = auVar88._2_2_ + sVar75;
        auVar93._4_2_ = auVar84._2_2_ + sVar75;
        auVar93._2_2_ = auVar88._0_2_ + auVar74._0_2_;
        auVar93._0_2_ = auVar84._0_2_ + auVar74._0_2_;
        auVar82._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar92._6_2_ + auVar86._6_2_,sVar89),
                                auVar92._4_2_ + auVar86._4_2_),
                       CONCAT22(auVar83._4_2_ + auVar81._4_2_,sVar89)) >> 0x10);
        auVar82._6_2_ = auVar92._2_2_ + auVar86._2_2_;
        auVar82._4_2_ = auVar83._2_2_ + auVar81._2_2_;
        auVar82._2_2_ = auVar92._0_2_ + auVar86._0_2_;
        auVar82._0_2_ = auVar83._0_2_ + auVar81._0_2_;
        auVar87._2_2_ = auVar88._8_2_ + sVar78;
        auVar87._0_2_ = auVar84._8_2_ + sVar78;
        auVar87._4_2_ = auVar84._10_2_ + sVar79;
        auVar87._6_2_ = auVar88._10_2_ + sVar79;
        auVar87._8_2_ = auVar84._12_2_ + sVar80;
        auVar87._10_2_ = auVar88._12_2_ + sVar80;
        auVar87._12_2_ = auVar84._14_2_ + uVar42;
        auVar87._14_2_ = auVar88._14_2_ + uVar42;
        auVar96._2_2_ = auVar92._8_2_ + auVar86._8_2_;
        auVar96._0_2_ = auVar83._8_2_ + auVar81._8_2_;
        auVar96._4_2_ = auVar83._10_2_ + auVar81._10_2_;
        auVar96._6_2_ = auVar92._10_2_ + auVar86._10_2_;
        auVar96._8_2_ = auVar83._12_2_ + auVar81._12_2_;
        auVar96._10_2_ = auVar92._12_2_ + auVar86._12_2_;
        auVar96._12_2_ = auVar83._14_2_ + auVar81._14_2_;
        auVar96._14_2_ = auVar92._14_2_ + auVar86._14_2_;
        auVar94 = pmaddwd(auVar93,auVar64);
        auVar82 = pmaddwd(auVar82,auVar65);
        auVar88 = pmaddwd(auVar87,auVar64);
        auVar87 = pmaddwd(auVar96,auVar65);
        auVar84._0_4_ = auVar82._0_4_ + auVar94._0_4_ + 0x40 >> 7;
        auVar84._4_4_ = auVar82._4_4_ + auVar94._4_4_ + 0x40 >> 7;
        auVar84._8_4_ = auVar82._8_4_ + auVar94._8_4_ + 0x40 >> 7;
        auVar84._12_4_ = auVar82._12_4_ + auVar94._12_4_ + 0x40 >> 7;
        auVar94._0_4_ = auVar87._0_4_ + auVar88._0_4_ + 0x40 >> 7;
        auVar94._4_4_ = auVar87._4_4_ + auVar88._4_4_ + 0x40 >> 7;
        auVar94._8_4_ = auVar87._8_4_ + auVar88._8_4_ + 0x40 >> 7;
        auVar94._12_4_ = auVar87._12_4_ + auVar88._12_4_ + 0x40 >> 7;
        auVar82 = packssdw(auVar84,auVar94);
        sVar85 = auVar82._0_2_;
        sVar89 = auVar82._2_2_;
        sVar2 = auVar82._4_2_;
        sVar3 = auVar82._6_2_;
        sVar4 = auVar82._8_2_;
        sVar5 = auVar82._10_2_;
        sVar6 = auVar82._12_2_;
        sVar7 = auVar82._14_2_;
        *(ulong *)(output + (int)(((uint)(uVar71 >> 1) & 0x7fffffff) * out_stride) + lVar68) =
             CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar82[0xe] - (0xff < sVar7),
                      CONCAT16((0 < sVar6) * (sVar6 < 0x100) * auVar82[0xc] - (0xff < sVar6),
                               CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar82[10] - (0xff < sVar5)
                                        ,CONCAT14((0 < sVar4) * (sVar4 < 0x100) * auVar82[8] -
                                                  (0xff < sVar4),
                                                  CONCAT13((0 < sVar3) * (sVar3 < 0x100) *
                                                           auVar82[6] - (0xff < sVar3),
                                                           CONCAT12((0 < sVar2) * (sVar2 < 0x100) *
                                                                    auVar82[4] - (0xff < sVar2),
                                                                    CONCAT11((0 < sVar89) *
                                                                             (sVar89 < 0x100) *
                                                                             auVar82[2] -
                                                                             (0xff < sVar89),
                                                                             (0 < sVar85) *
                                                                             (sVar85 < 0x100) *
                                                                             auVar82[0] -
                                                                             (0xff < sVar85))))))));
        auVar82 = auVar86;
        auVar87 = auVar81;
        auVar81 = auVar74;
        auVar84 = auVar83;
        auVar86 = auVar74;
        auVar88 = auVar92;
      }
      puVar69 = puVar69 + 8;
    }
    if (stride % 8 == 0) {
      return true;
    }
  }
  _Var66 = av1_resize_vert_dir_c(intbuf,output,out_stride,height,height2,stride,start_col_00);
  return _Var66;
}

Assistant:

bool av1_resize_vert_dir_sse2(uint8_t *intbuf, uint8_t *output, int out_stride,
                              int height, int height2, int stride,
                              int start_col) {
  // For the GM tool, the input layer height or width is assured to be an even
  // number. Hence the function 'down2_symodd()' is not invoked and SIMD
  // optimization of the same is not implemented.
  // When the input height is less than 8 and even, the potential input
  // heights are limited to 2, 4, or 6. These scenarios require seperate
  // handling due to padding requirements. Invoking the C function here will
  // eliminate the need for conditional statements within the subsequent SIMD
  // code to manage these cases.
  if (height & 1 || height < 8) {
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, start_col);
  }

  __m128i coeffs_y[2];
  const int bits = FILTER_BITS;
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const uint8_t max_pixel = 255;
  const __m128i clip_pixel = _mm_set1_epi8((char)max_pixel);
  const __m128i zero = _mm_setzero_si128();
  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_y);

  const int remain_col = stride % 8;

  for (int j = start_col; j < stride - remain_col; j += 8) {
    uint8_t *data = &intbuf[j];
    // d0 ... d7
    const __m128i l8_3 = _mm_loadl_epi64((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with the last available row at the top.
    // a0 ... a7
    const __m128i l8_0 = l8_3;
    // b0 ... b7
    const __m128i l8_1 = l8_3;
    // c0 ... c7
    const __m128i l8_2 = l8_3;
    // e0 ... e7
    const __m128i l8_4 = _mm_loadl_epi64((__m128i *)(data + 1 * stride));
    // f0 ... f7
    const __m128i l8_5 = _mm_loadl_epi64((__m128i *)(data + 2 * stride));

    // Convert to 16bit as addition of 2 source pixel crosses 8 bit.
    __m128i l0 = _mm_unpacklo_epi8(l8_0, zero);  // A(128bit) = a0 - a7(16 bit)
    __m128i l1 = _mm_unpacklo_epi8(l8_1, zero);  // B(128bit) = b0 - b7(16 bit)
    __m128i l2 = _mm_unpacklo_epi8(l8_2, zero);  // C(128bit) = c0 - c7(16 bit)
    __m128i l3 = _mm_unpacklo_epi8(l8_3, zero);  // D(128bit) = d0 - d7(16 bit)
    __m128i l4 = _mm_unpacklo_epi8(l8_4, zero);  // E(128bit) = e0 - e7(16 bit)
    __m128i l5 = _mm_unpacklo_epi8(l8_5, zero);  // F(128bit) = f0 - f7(16 bit)

    // Increment the pointer such that the loading starts from row G.
    data = data + 3 * stride;
    // The core vertical SIMD processes 2 input rows simultaneously to generate
    // output corresponding to 1 row. To streamline the core loop and eliminate
    // the need for conditional checks, the remaining rows 4 are processed
    // separately.
    for (int i = 0; i < height - 4; i += 2) {
      // g0 ... g7
      __m128i l8_6 = _mm_loadl_epi64((__m128i *)(data));
      // h0 ... h7
      __m128i l8_7 = _mm_loadl_epi64((__m128i *)(data + stride));
      __m128i l6 = _mm_unpacklo_epi8(l8_6, zero);  // G(128bit):g0-g7(16b)
      __m128i l7 = _mm_unpacklo_epi8(l8_7, zero);  // H(128bit):h0-h7(16b)

      PROCESS_RESIZE_Y_WD8
    }

    __m128i l8_6 = _mm_loadl_epi64((__m128i *)(data));
    __m128i l6 = _mm_unpacklo_epi8(l8_6, zero);
    // Process the last 4 input rows here.
    for (int i = height - 4; i < height; i += 2) {
      __m128i l7 = l6;
      PROCESS_RESIZE_Y_WD8
    }
  }

  if (remain_col)
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, stride - remain_col);

  return true;
}